

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::SignTransaction(CWallet *this,CMutableTransaction *tx)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  reference pCVar5;
  size_type sVar6;
  TxStateConfirmed *pTVar7;
  long in_FS_OFFSET;
  int prev_height;
  CWalletTx *wtx;
  CTxIn *input;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  const_iterator mi;
  iterator __end1;
  iterator __begin1;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  CTxOut *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *in_stack_fffffffffffffea0;
  const_reference in_stack_fffffffffffffea8;
  int sighash;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  CWallet *in_stack_fffffffffffffec0;
  bool local_b9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (char *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             (AnnotatedMixin<std::recursive_mutex> *)0x1b461b);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
       *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe80);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe80);
  do {
    sighash = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    bVar3 = __gnu_cxx::operator==<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                       (__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       in_stack_fffffffffffffe80);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::
      map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
      ::map((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
             *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_b9 = SignTransaction(in_stack_fffffffffffffec0,
                                 (CMutableTransaction *)
                                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                 (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                                 sighash,(map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                                          *)in_stack_fffffffffffffea0);
      std::
      map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
      ::~map((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
              *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
LAB_001b498f:
      std::
      map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return local_b9;
      }
      __stack_chk_fail();
    }
    pCVar5 = __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
             operator*((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
            *)in_stack_fffffffffffffe80,
           (key_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           *)in_stack_fffffffffffffe80);
    bVar4 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                       (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_fffffffffffffe80);
    bVar3 = true;
    if (!bVar4) {
      uVar1 = (pCVar5->prevout).n;
      std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *
                   )CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      sVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      bVar3 = sVar6 <= uVar1;
    }
    if (bVar3) {
      local_b9 = false;
      goto LAB_001b498f;
    }
    std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
    operator->((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    pTVar7 = CWalletTx::state<wallet::TxStateConfirmed>
                       ((CWalletTx *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (pTVar7 == (TxStateConfirmed *)0x0) {
      in_stack_fffffffffffffeb4 = 0;
    }
    else {
      in_stack_fffffffffffffec0 =
           (CWallet *)
           CWalletTx::state<wallet::TxStateConfirmed>
                     ((CWalletTx *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      in_stack_fffffffffffffeb4 =
           *(undefined4 *)
            &(in_stack_fffffffffffffec0->vMasterKey).
             super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    }
    in_stack_fffffffffffffebc = in_stack_fffffffffffffeb4;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    in_stack_fffffffffffffea8 =
         std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                   ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                    CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                    (size_type)in_stack_fffffffffffffe80);
    bVar3 = CWalletTx::IsCoinBase
                      ((CWalletTx *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    in_stack_fffffffffffffeb8 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffeb8);
    Coin::Coin((Coin *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
    in_stack_fffffffffffffea0 =
         (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *)std::
            map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
            ::operator[](in_stack_fffffffffffffea0,
                         (key_type *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    Coin::operator=((Coin *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                    (Coin *)in_stack_fffffffffffffe80);
    Coin::~Coin((Coin *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    __gnu_cxx::__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::operator++
              ((__normal_iterator<CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  } while( true );
}

Assistant:

bool CWallet::SignTransaction(CMutableTransaction& tx) const
{
    AssertLockHeld(cs_wallet);

    // Build coins map
    std::map<COutPoint, Coin> coins;
    for (auto& input : tx.vin) {
        const auto mi = mapWallet.find(input.prevout.hash);
        if(mi == mapWallet.end() || input.prevout.n >= mi->second.tx->vout.size()) {
            return false;
        }
        const CWalletTx& wtx = mi->second;
        int prev_height = wtx.state<TxStateConfirmed>() ? wtx.state<TxStateConfirmed>()->confirmed_block_height : 0;
        coins[input.prevout] = Coin(wtx.tx->vout[input.prevout.n], prev_height, wtx.IsCoinBase());
    }
    std::map<int, bilingual_str> input_errors;
    return SignTransaction(tx, coins, SIGHASH_DEFAULT, input_errors);
}